

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_inttable_next(upb_inttable *t,uintptr_t *key,upb_value *val,intptr_t *iter)

{
  upb_tabent *puVar1;
  _Bool _Var2;
  size_t sVar3;
  upb_value *puVar4;
  ulong uVar5;
  ulong key_00;
  ulong uVar6;
  
  uVar6 = *iter;
  uVar5 = (ulong)t->array_size;
  if (uVar5 < uVar6 + 1) {
LAB_0040c1fc:
    sVar3 = next(&t->t,uVar6 - uVar5);
    if (sVar3 < (t->t).mask + 1) {
      puVar1 = (t->t).entries;
      *key = (uintptr_t)puVar1[sVar3].key;
      val->val = puVar1[sVar3].val.val;
      key_00 = uVar5 + sVar3;
      _Var2 = true;
    }
    else {
      key_00 = 0x7ffffffffffffffe;
      _Var2 = false;
    }
  }
  else {
    do {
      key_00 = uVar6 + 1;
      uVar5 = (ulong)t->array_size;
      if (uVar5 <= key_00) goto LAB_0040c1fc;
      puVar4 = inttable_array_get(t,key_00);
      uVar6 = key_00;
    } while (puVar4 == (upb_value *)0x0);
    *key = key_00;
    val->val = puVar4->val;
    _Var2 = true;
  }
  *iter = key_00;
  return _Var2;
}

Assistant:

bool upb_inttable_next(const upb_inttable* t, uintptr_t* key, upb_value* val,
                       intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)(i + 1) <= t->array_size) {
    while ((size_t)++i < t->array_size) {
      const upb_value* ent = inttable_array_get(t, i);
      if (ent) {
        *key = i;
        *val = *ent;
        *iter = i;
        return true;
      }
    }
    i--;  // Back up to exactly one position before the start of the table.
  }

  size_t tab_idx = next(&t->t, i - t->array_size);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = ent->key.num;
    *val = ent->val;
    *iter = tab_idx + t->array_size;
    return true;
  } else {
    // We should set the iterator any way. When we are done, the iterator value
    // is invalidated. `upb_inttable_done` will check on the iterator value to
    // determine if the iteration is done.
    *iter = INTPTR_MAX - 1;  // To disambiguate from UPB_INTTABLE_BEGIN, to
                             // match the behavior of `upb_strtable_iter`.
    return false;
  }
}